

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

string * QPDF::compute_data_key
                   (string *__return_storage_ptr__,string *encryption_key,int objid,int generation,
                   bool use_aes,int encryption_V,int encryption_R)

{
  unsigned_long uVar1;
  undefined4 in_register_0000000c;
  uchar *md;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t n;
  char *d;
  size_type sVar2;
  string result;
  MD5 md5;
  int local_3c;
  Digest digest;
  
  md = (uchar *)CONCAT44(in_register_0000000c,generation);
  std::__cxx11::string::string((string *)&result,(string *)encryption_key);
  if (encryption_V < 5) {
    std::__cxx11::string::append((ulong)&result,'\x01');
    std::__cxx11::string::append((ulong)&result,'\x01');
    std::__cxx11::string::append((ulong)&result,'\x01');
    std::__cxx11::string::append((ulong)&result,'\x01');
    d = (char *)0x1;
    std::__cxx11::string::append((ulong)&result,'\x01');
    n = extraout_RDX;
    if (use_aes) {
      d = "sAlT";
      std::__cxx11::string::append((char *)&result);
      n = extraout_RDX_00;
    }
    MD5::MD5(&md5,(uchar *)d,n,md);
    MD5::encodeDataIncrementally(&md5,result._M_dataplus._M_p,result._M_string_length);
    MD5::digest(&md5,digest);
    sVar2 = result._M_string_length;
    local_3c = 0x10;
    uVar1 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&local_3c);
    if (uVar1 < sVar2) {
      sVar2 = uVar1;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,digest,digest + sVar2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p == &result.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(result.field_2._M_allocated_capacity._1_7_,result.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = result.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = result._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(result.field_2._M_allocated_capacity._1_7_,result.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = result._M_string_length;
    result._M_string_length = 0;
    result.field_2._M_local_buf[0] = '\0';
    result._M_dataplus._M_p = (pointer)&result.field_2;
  }
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF::compute_data_key(
    std::string const& encryption_key,
    int objid,
    int generation,
    bool use_aes,
    int encryption_V,
    int encryption_R)
{
    // Algorithm 3.1 from the PDF 1.7 Reference Manual

    std::string result = encryption_key;

    if (encryption_V >= 5) {
        // Algorithm 3.1a (PDF 1.7 extension level 3): just use encryption key straight.
        return result;
    }

    // Append low three bytes of object ID and low two bytes of generation
    result.append(1, static_cast<char>(objid & 0xff));
    result.append(1, static_cast<char>((objid >> 8) & 0xff));
    result.append(1, static_cast<char>((objid >> 16) & 0xff));
    result.append(1, static_cast<char>(generation & 0xff));
    result.append(1, static_cast<char>((generation >> 8) & 0xff));
    if (use_aes) {
        result += "sAlT";
    }

    MD5 md5;
    md5.encodeDataIncrementally(result.c_str(), result.length());
    MD5::Digest digest;
    md5.digest(digest);
    return {reinterpret_cast<char*>(digest), std::min(result.length(), toS(16))};
}